

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_private(mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng,uchar *input,uchar *output)

{
  int iVar1;
  undefined1 local_148 [8];
  mbedtls_mpi C;
  mbedtls_mpi I;
  mbedtls_mpi *DQ;
  mbedtls_mpi *DP;
  mbedtls_mpi DQ_blind;
  mbedtls_mpi DP_blind;
  mbedtls_mpi TQ;
  mbedtls_mpi TP;
  mbedtls_mpi R;
  mbedtls_mpi Q1;
  mbedtls_mpi P1;
  mbedtls_mpi T;
  size_t olen;
  int ret;
  uchar *output_local;
  uchar *input_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  DQ = &ctx->DP;
  I.p = (mbedtls_mpi_uint *)&ctx->DQ;
  iVar1 = rsa_check_context(ctx,1,(uint)(f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0));
  if (iVar1 != 0) {
    return -0x4080;
  }
  mbedtls_mpi_init((mbedtls_mpi *)&P1.p);
  mbedtls_mpi_init((mbedtls_mpi *)&Q1.p);
  mbedtls_mpi_init((mbedtls_mpi *)&R.p);
  mbedtls_mpi_init((mbedtls_mpi *)&TP.p);
  if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    mbedtls_mpi_init((mbedtls_mpi *)&DQ_blind.p);
    mbedtls_mpi_init((mbedtls_mpi *)&DP);
  }
  mbedtls_mpi_init((mbedtls_mpi *)&TQ.p);
  mbedtls_mpi_init((mbedtls_mpi *)&DP_blind.p);
  mbedtls_mpi_init((mbedtls_mpi *)&C.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_148);
  olen._4_4_ = mbedtls_mpi_read_binary((mbedtls_mpi *)&P1.p,input,ctx->len);
  if (olen._4_4_ == 0) {
    iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&P1.p,&ctx->N);
    if (iVar1 < 0) {
      olen._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&C.p,(mbedtls_mpi *)&P1.p);
      if (olen._4_4_ == 0) {
        if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
          olen._4_4_ = rsa_prepare_blinding(ctx,f_rng,p_rng);
          if (((((olen._4_4_ != 0) ||
                (olen._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&P1.p,(mbedtls_mpi *)&P1.p,&ctx->Vi
                                                 ), olen._4_4_ != 0)) ||
               (olen._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&P1.p,(mbedtls_mpi *)&P1.p,&ctx->N),
               olen._4_4_ != 0)) ||
              ((olen._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&Q1.p,&ctx->P,1), olen._4_4_ != 0 ||
               (olen._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&R.p,&ctx->Q,1), olen._4_4_ != 0))))
             || ((olen._4_4_ = mbedtls_mpi_fill_random((mbedtls_mpi *)&TP.p,0x1c,f_rng,p_rng),
                 olen._4_4_ != 0 ||
                 ((olen._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&DQ_blind.p,(mbedtls_mpi *)&Q1.p,
                                                    (mbedtls_mpi *)&TP.p), olen._4_4_ != 0 ||
                  (olen._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&DQ_blind.p,
                                                    (mbedtls_mpi *)&DQ_blind.p,&ctx->DP),
                  olen._4_4_ != 0)))))) goto LAB_00119ebf;
          DQ = (mbedtls_mpi *)&DQ_blind.p;
          olen._4_4_ = mbedtls_mpi_fill_random((mbedtls_mpi *)&TP.p,0x1c,f_rng,p_rng);
          if ((olen._4_4_ != 0) ||
             ((olen._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&DP,(mbedtls_mpi *)&R.p,
                                                (mbedtls_mpi *)&TP.p), olen._4_4_ != 0 ||
              (olen._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&DP,(mbedtls_mpi *)&DP,&ctx->DQ),
              olen._4_4_ != 0)))) goto LAB_00119ebf;
          I.p = (mbedtls_mpi_uint *)&DP;
        }
        olen._4_4_ = mbedtls_mpi_exp_mod((mbedtls_mpi *)&TQ.p,(mbedtls_mpi *)&P1.p,DQ,&ctx->P,
                                         &ctx->RP);
        if (((((olen._4_4_ == 0) &&
              (olen._4_4_ = mbedtls_mpi_exp_mod((mbedtls_mpi *)&DP_blind.p,(mbedtls_mpi *)&P1.p,
                                                (mbedtls_mpi *)I.p,&ctx->Q,&ctx->RQ),
              olen._4_4_ == 0)) &&
             (olen._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&P1.p,(mbedtls_mpi *)&TQ.p,
                                               (mbedtls_mpi *)&DP_blind.p), olen._4_4_ == 0)) &&
            (((olen._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&TQ.p,(mbedtls_mpi *)&P1.p,&ctx->QP),
              olen._4_4_ == 0 &&
              (olen._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&P1.p,(mbedtls_mpi *)&TQ.p,&ctx->P),
              olen._4_4_ == 0)) &&
             ((olen._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&TQ.p,(mbedtls_mpi *)&P1.p,&ctx->Q),
              olen._4_4_ == 0 &&
              (olen._4_4_ = mbedtls_mpi_add_mpi((mbedtls_mpi *)&P1.p,(mbedtls_mpi *)&DP_blind.p,
                                                (mbedtls_mpi *)&TQ.p), olen._4_4_ == 0)))))) &&
           (((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
             ((olen._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&P1.p,(mbedtls_mpi *)&P1.p,&ctx->Vf),
              olen._4_4_ == 0 &&
              (olen._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&P1.p,(mbedtls_mpi *)&P1.p,&ctx->N),
              olen._4_4_ == 0)))) &&
            (olen._4_4_ = mbedtls_mpi_exp_mod((mbedtls_mpi *)local_148,(mbedtls_mpi *)&P1.p,&ctx->E,
                                              &ctx->N,&ctx->RN), olen._4_4_ == 0)))) {
          iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)local_148,(mbedtls_mpi *)&C.p);
          if (iVar1 == 0) {
            olen._4_4_ = mbedtls_mpi_write_binary((mbedtls_mpi *)&P1.p,output,ctx->len);
          }
          else {
            olen._4_4_ = -0x4380;
          }
        }
      }
    }
    else {
      olen._4_4_ = -4;
    }
  }
LAB_00119ebf:
  mbedtls_mpi_free((mbedtls_mpi *)&Q1.p);
  mbedtls_mpi_free((mbedtls_mpi *)&R.p);
  mbedtls_mpi_free((mbedtls_mpi *)&TP.p);
  if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    mbedtls_mpi_free((mbedtls_mpi *)&DQ_blind.p);
    mbedtls_mpi_free((mbedtls_mpi *)&DP);
  }
  mbedtls_mpi_free((mbedtls_mpi *)&P1.p);
  mbedtls_mpi_free((mbedtls_mpi *)&TQ.p);
  mbedtls_mpi_free((mbedtls_mpi *)&DP_blind.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_148);
  mbedtls_mpi_free((mbedtls_mpi *)&C.p);
  if (olen._4_4_ == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = olen._4_4_ + -0x4300;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_private( mbedtls_rsa_context *ctx,
                 int (*f_rng)(void *, unsigned char *, size_t),
                 void *p_rng,
                 const unsigned char *input,
                 unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen;

    /* Temporary holding the result */
    mbedtls_mpi T;

    /* Temporaries holding P-1, Q-1 and the
     * exponent blinding factor, respectively. */
    mbedtls_mpi P1, Q1, R;

#if !defined(MBEDTLS_RSA_NO_CRT)
    /* Temporaries holding the results mod p resp. mod q. */
    mbedtls_mpi TP, TQ;

    /* Temporaries holding the blinded exponents for
     * the mod p resp. mod q computation (if used). */
    mbedtls_mpi DP_blind, DQ_blind;

    /* Pointers to actual exponents to be used - either the unblinded
     * or the blinded ones, depending on the presence of a PRNG. */
    mbedtls_mpi *DP = &ctx->DP;
    mbedtls_mpi *DQ = &ctx->DQ;
#else
    /* Temporary holding the blinded exponent (if used). */
    mbedtls_mpi D_blind;

    /* Pointer to actual exponent to be used - either the unblinded
     * or the blinded one, depending on the presence of a PRNG. */
    mbedtls_mpi *D = &ctx->D;
#endif /* MBEDTLS_RSA_NO_CRT */

    /* Temporaries holding the initial input and the double
     * checked result; should be the same in the end. */
    mbedtls_mpi I, C;

    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( input  != NULL );
    RSA_VALIDATE_RET( output != NULL );

    if( rsa_check_context( ctx, 1             /* private key checks */,
                                f_rng != NULL /* blinding y/n       */ ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    /* MPI Initialization */
    mbedtls_mpi_init( &T );

    mbedtls_mpi_init( &P1 );
    mbedtls_mpi_init( &Q1 );
    mbedtls_mpi_init( &R );

    if( f_rng != NULL )
    {
#if defined(MBEDTLS_RSA_NO_CRT)
        mbedtls_mpi_init( &D_blind );
#else
        mbedtls_mpi_init( &DP_blind );
        mbedtls_mpi_init( &DQ_blind );
#endif
    }

#if !defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_init( &TP ); mbedtls_mpi_init( &TQ );
#endif

    mbedtls_mpi_init( &I );
    mbedtls_mpi_init( &C );

    /* End of MPI initialization */

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &T, input, ctx->len ) );
    if( mbedtls_mpi_cmp_mpi( &T, &ctx->N ) >= 0 )
    {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &I, &T ) );

    if( f_rng != NULL )
    {
        /*
         * Blinding
         * T = T * Vi mod N
         */
        MBEDTLS_MPI_CHK( rsa_prepare_blinding( ctx, f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &T, &ctx->Vi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &T, &ctx->N ) );

        /*
         * Exponent blinding
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &P1, &ctx->P, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &Q1, &ctx->Q, 1 ) );

#if defined(MBEDTLS_RSA_NO_CRT)
        /*
         * D_blind = ( P - 1 ) * ( Q - 1 ) * R + D
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &R, RSA_EXPONENT_BLINDING,
                         f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &D_blind, &P1, &Q1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &D_blind, &D_blind, &R ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &D_blind, &D_blind, &ctx->D ) );

        D = &D_blind;
#else
        /*
         * DP_blind = ( P - 1 ) * R + DP
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &R, RSA_EXPONENT_BLINDING,
                         f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &DP_blind, &P1, &R ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &DP_blind, &DP_blind,
                    &ctx->DP ) );

        DP = &DP_blind;

        /*
         * DQ_blind = ( Q - 1 ) * R + DQ
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &R, RSA_EXPONENT_BLINDING,
                         f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &DQ_blind, &Q1, &R ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &DQ_blind, &DQ_blind,
                    &ctx->DQ ) );

        DQ = &DQ_blind;
#endif /* MBEDTLS_RSA_NO_CRT */
    }

#if defined(MBEDTLS_RSA_NO_CRT)
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T, &T, D, &ctx->N, &ctx->RN ) );
#else
    /*
     * Faster decryption using the CRT
     *
     * TP = input ^ dP mod P
     * TQ = input ^ dQ mod Q
     */

    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &TP, &T, DP, &ctx->P, &ctx->RP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &TQ, &T, DQ, &ctx->Q, &ctx->RQ ) );

    /*
     * T = (TP - TQ) * (Q^-1 mod P) mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T, &TP, &TQ ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &TP, &T, &ctx->QP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &TP, &ctx->P ) );

    /*
     * T = TQ + T * Q
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &TP, &T, &ctx->Q ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &T, &TQ, &TP ) );
#endif /* MBEDTLS_RSA_NO_CRT */

    if( f_rng != NULL )
    {
        /*
         * Unblind
         * T = T * Vf mod N
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &T, &ctx->Vf ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &T, &ctx->N ) );
    }

    /* Verify the result to prevent glitching attacks. */
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &C, &T, &ctx->E,
                                          &ctx->N, &ctx->RN ) );
    if( mbedtls_mpi_cmp_mpi( &C, &I ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto cleanup;
    }

    olen = ctx->len;
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &T, output, olen ) );

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    mbedtls_mpi_free( &P1 );
    mbedtls_mpi_free( &Q1 );
    mbedtls_mpi_free( &R );

    if( f_rng != NULL )
    {
#if defined(MBEDTLS_RSA_NO_CRT)
        mbedtls_mpi_free( &D_blind );
#else
        mbedtls_mpi_free( &DP_blind );
        mbedtls_mpi_free( &DQ_blind );
#endif
    }

    mbedtls_mpi_free( &T );

#if !defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_free( &TP ); mbedtls_mpi_free( &TQ );
#endif

    mbedtls_mpi_free( &C );
    mbedtls_mpi_free( &I );

    if( ret != 0 )
        return( MBEDTLS_ERR_RSA_PRIVATE_FAILED + ret );

    return( 0 );
}